

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O0

string * __thiscall
t_xml_generator::escape_xml_string
          (string *__return_storage_ptr__,t_xml_generator *this,string *input)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_1b0;
  char iter;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  ostringstream ss;
  string *input_local;
  t_xml_generator *this_local;
  
  ss._368_8_ = input;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range1);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_1b0._M_current = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffe50), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    switch(*pcVar2) {
    case '\"':
      std::operator<<((ostream *)&__range1,"&quot;");
      break;
    default:
      std::operator<<((ostream *)&__range1,*pcVar2);
      break;
    case '&':
      std::operator<<((ostream *)&__range1,"&amp;");
      break;
    case '\'':
      std::operator<<((ostream *)&__range1,"&apos;");
      break;
    case '<':
      std::operator<<((ostream *)&__range1,"&lt;");
      break;
    case '>':
      std::operator<<((ostream *)&__range1,"&gt;");
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

string t_xml_generator::escape_xml_string(const string& input) {
  std::ostringstream ss;
  for (char iter : input) {
    switch (iter) {
    case '&':
      ss << "&amp;";
      break;
    case '"':
      ss << "&quot;";
      break;
    case '\'':
      ss << "&apos;";
      break;
    case '<':
      ss << "&lt;";
      break;
    case '>':
      ss << "&gt;";
      break;
    default:
      ss << iter;
      break;
    }
  }
  return ss.str();
}